

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-time-dependent.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
DummyClass<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::fun
          (DummyClass<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *res,int t)

{
  bool bVar1;
  type ppSVar2;
  type ppSVar3;
  byte local_ca;
  byte local_c9;
  string local_c0;
  SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_a0;
  sigString_t *ptr_1;
  _List_iterator<dynamicgraph::SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*>
  _Stack_90;
  bool _foreach_continue39;
  auto_any_base *local_88;
  auto_any_t _foreach_end39;
  auto_any_base *local_78;
  auto_any_t _foreach_cur39;
  auto_any_t local_68;
  auto_any_t _foreach_col39;
  sigDouble_t *ptr;
  _List_iterator<dynamicgraph::SignalTimeDependent<double,_int>_*> _Stack_50;
  bool _foreach_continue37;
  auto_any_base *local_48;
  auto_any_t _foreach_end37;
  auto_any_base *local_38;
  auto_any_t _foreach_cur37;
  auto_any_t local_28;
  auto_any_t _foreach_col37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_18;
  int t_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *res_local;
  DummyClass<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  this->call = this->call + 1;
  this->timedata = t;
  _foreach_col37._4_4_ = t;
  pbStack_18 = res;
  res_local = &this->proname;
  _foreach_cur37 =
       (auto_any_t)
       boost::foreach_detail_::
       contain<std::__cxx11::list<dynamicgraph::SignalTimeDependent<double,int>*,std::allocator<dynamicgraph::SignalTimeDependent<double,int>*>>>
                 (&this->inputsig,(false_ *)0x0);
  local_28 = (auto_any_t)&_foreach_cur37;
  bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_28);
  if (!bVar1) {
    _foreach_end37 =
         (auto_any_t)
         boost::foreach_detail_::
         begin<std::__cxx11::list<dynamicgraph::SignalTimeDependent<double,int>*,std::allocator<dynamicgraph::SignalTimeDependent<double,int>*>>,mpl_::bool_<false>>
                   (local_28,(type2type<std::__cxx11::list<dynamicgraph::SignalTimeDependent<double,_int>_*,_std::allocator<dynamicgraph::SignalTimeDependent<double,_int>_*>_>,_mpl_::bool_<false>_>
                              *)0x0,(false_ *)0x0);
    local_38 = (auto_any_base *)&_foreach_end37;
    bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_38);
    if (!bVar1) {
      _Stack_50._M_node =
           (_List_node_base *)
           boost::foreach_detail_::
           end<std::__cxx11::list<dynamicgraph::SignalTimeDependent<double,int>*,std::allocator<dynamicgraph::SignalTimeDependent<double,int>*>>,mpl_::bool_<false>>
                     (local_28,(type2type<std::__cxx11::list<dynamicgraph::SignalTimeDependent<double,_int>_*,_std::allocator<dynamicgraph::SignalTimeDependent<double,_int>_*>_>,_mpl_::bool_<false>_>
                                *)0x0,(false_ *)0x0);
      local_48 = (auto_any_base *)&stack0xffffffffffffffb0;
      bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_48);
      if (!bVar1) {
        ptr._7_1_ = 1;
        while( true ) {
          local_c9 = 0;
          if ((ptr._7_1_ & 1) != 0) {
            bVar1 = boost::foreach_detail_::
                    done<std::__cxx11::list<dynamicgraph::SignalTimeDependent<double,int>*,std::allocator<dynamicgraph::SignalTimeDependent<double,int>*>>,mpl_::bool_<false>>
                              (local_38,local_48,
                               (type2type<std::__cxx11::list<dynamicgraph::SignalTimeDependent<double,_int>_*,_std::allocator<dynamicgraph::SignalTimeDependent<double,_int>_*>_>,_mpl_::bool_<false>_>
                                *)0x0);
            local_c9 = bVar1 ^ 0xff;
          }
          if ((local_c9 & 1) == 0) break;
          bVar1 = boost::foreach_detail_::set_false((bool *)((long)&ptr + 7));
          if (!bVar1) {
            ppSVar2 = boost::foreach_detail_::
                      deref<std::__cxx11::list<dynamicgraph::SignalTimeDependent<double,int>*,std::allocator<dynamicgraph::SignalTimeDependent<double,int>*>>,mpl_::bool_<false>>
                                (local_38,(type2type<std::__cxx11::list<dynamicgraph::SignalTimeDependent<double,_int>_*,_std::allocator<dynamicgraph::SignalTimeDependent<double,_int>_*>_>,_mpl_::bool_<false>_>
                                           *)0x0);
            _foreach_col39 = (auto_any_t)*ppSVar2;
            while (((ptr._7_1_ ^ 0xff) & 1) != 0) {
              (**(code **)(*(long *)_foreach_col39 + 0x20))(_foreach_col39,&this->timedata);
              ptr._7_1_ = 1;
            }
          }
          if ((ptr._7_1_ & 1) != 0) {
            boost::foreach_detail_::
            next<std::__cxx11::list<dynamicgraph::SignalTimeDependent<double,int>*,std::allocator<dynamicgraph::SignalTimeDependent<double,int>*>>,mpl_::bool_<false>>
                      (local_38,(type2type<std::__cxx11::list<dynamicgraph::SignalTimeDependent<double,_int>_*,_std::allocator<dynamicgraph::SignalTimeDependent<double,_int>_*>_>,_mpl_::bool_<false>_>
                                 *)0x0);
          }
        }
      }
    }
  }
  _foreach_cur39 =
       (auto_any_t)
       boost::foreach_detail_::
       contain<std::__cxx11::list<dynamicgraph::SignalTimeDependent<std::__cxx11::string,int>*,std::allocator<dynamicgraph::SignalTimeDependent<std::__cxx11::string,int>*>>>
                 (&this->inputsigV,(false_ *)0x0);
  local_68 = (auto_any_t)&_foreach_cur39;
  bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_68);
  if (!bVar1) {
    _foreach_end39 =
         (auto_any_t)
         boost::foreach_detail_::
         begin<std::__cxx11::list<dynamicgraph::SignalTimeDependent<std::__cxx11::string,int>*,std::allocator<dynamicgraph::SignalTimeDependent<std::__cxx11::string,int>*>>,mpl_::bool_<false>>
                   (local_68,(type2type<std::__cxx11::list<dynamicgraph::SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::allocator<dynamicgraph::SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*>_>,_mpl_::bool_<false>_>
                              *)0x0,(false_ *)0x0);
    local_78 = (auto_any_base *)&_foreach_end39;
    bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_78);
    if (!bVar1) {
      _Stack_90._M_node =
           (_List_node_base *)
           boost::foreach_detail_::
           end<std::__cxx11::list<dynamicgraph::SignalTimeDependent<std::__cxx11::string,int>*,std::allocator<dynamicgraph::SignalTimeDependent<std::__cxx11::string,int>*>>,mpl_::bool_<false>>
                     (local_68,(type2type<std::__cxx11::list<dynamicgraph::SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::allocator<dynamicgraph::SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*>_>,_mpl_::bool_<false>_>
                                *)0x0,(false_ *)0x0);
      local_88 = (auto_any_base *)&stack0xffffffffffffff70;
      bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_88);
      if (!bVar1) {
        ptr_1._7_1_ = 1;
        while( true ) {
          local_ca = 0;
          if ((ptr_1._7_1_ & 1) != 0) {
            bVar1 = boost::foreach_detail_::
                    done<std::__cxx11::list<dynamicgraph::SignalTimeDependent<std::__cxx11::string,int>*,std::allocator<dynamicgraph::SignalTimeDependent<std::__cxx11::string,int>*>>,mpl_::bool_<false>>
                              (local_78,local_88,
                               (type2type<std::__cxx11::list<dynamicgraph::SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::allocator<dynamicgraph::SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*>_>,_mpl_::bool_<false>_>
                                *)0x0);
            local_ca = bVar1 ^ 0xff;
          }
          if ((local_ca & 1) == 0) break;
          bVar1 = boost::foreach_detail_::set_false((bool *)((long)&ptr_1 + 7));
          if (!bVar1) {
            ppSVar3 = boost::foreach_detail_::
                      deref<std::__cxx11::list<dynamicgraph::SignalTimeDependent<std::__cxx11::string,int>*,std::allocator<dynamicgraph::SignalTimeDependent<std::__cxx11::string,int>*>>,mpl_::bool_<false>>
                                (local_78,(type2type<std::__cxx11::list<dynamicgraph::SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::allocator<dynamicgraph::SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*>_>,_mpl_::bool_<false>_>
                                           *)0x0);
            local_a0 = *ppSVar3;
            while (((ptr_1._7_1_ ^ 0xff) & 1) != 0) {
              (*(local_a0->super_TimeDependency<int>)._vptr_TimeDependency[4])
                        (local_a0,&this->timedata);
              ptr_1._7_1_ = 1;
            }
          }
          if ((ptr_1._7_1_ & 1) != 0) {
            boost::foreach_detail_::
            next<std::__cxx11::list<dynamicgraph::SignalTimeDependent<std::__cxx11::string,int>*,std::allocator<dynamicgraph::SignalTimeDependent<std::__cxx11::string,int>*>>,mpl_::bool_<false>>
                      (local_78,(type2type<std::__cxx11::list<dynamicgraph::SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::allocator<dynamicgraph::SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*>_>,_mpl_::bool_<false>_>
                                 *)0x0);
          }
        }
      }
    }
  }
  operator()(&local_c0,this);
  std::__cxx11::string::operator=((string *)pbStack_18,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  return pbStack_18;
}

Assistant:

T &fun(T &res, int t) {
    ++call;
    timedata = t;

    BOOST_FOREACH (sigDouble_t *ptr, inputsig) ptr->access(timedata);

    BOOST_FOREACH (sigString_t *ptr, inputsigV) ptr->access(timedata);

    res = (*this)();
    return res;
  }